

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int cmp_greediness(Parser *p,PNode *x,PNode *y)

{
  long lVar1;
  long lVar2;
  undefined1 local_80 [8];
  VecPNode pvy;
  VecPNode pvx;
  uint local_28;
  int ret;
  uint iy;
  uint ix;
  PNode *y_local;
  PNode *x_local;
  Parser *p_local;
  
  ret = 0;
  local_28 = 0;
  pvx.e[2]._4_4_ = 0;
  pvy.e[2]._0_4_ = 0;
  pvx.n = 0;
  pvx.i = 0;
  local_80._0_4_ = 0;
  pvy.n = 0;
  pvy.i = 0;
  get_unshared_pnodes(p,x,y,(VecPNode *)(pvy.e + 2),(VecPNode *)local_80);
  if (pvx._0_8_ != 0) {
    qsort((void *)pvx._0_8_,(ulong)(uint)pvy.e[2],8,greedycmp);
  }
  if (pvy._0_8_ != 0) {
    qsort((void *)pvy._0_8_,(ulong)(uint)local_80._0_4_,8,greedycmp);
  }
  while (((uint)ret < (uint)pvy.e[2] && (local_28 < (uint)local_80._0_4_))) {
    lVar1 = *(long *)(pvx._0_8_ + (ulong)(uint)ret * 8);
    lVar2 = *(long *)(pvy._0_8_ + (ulong)local_28 * 8);
    if (lVar1 == lVar2) {
      ret = ret + 1;
      local_28 = local_28 + 1;
    }
    else if (*(ulong *)(lVar1 + 0x98) < *(ulong *)(lVar2 + 0x98)) {
      ret = ret + 1;
    }
    else if (*(ulong *)(lVar2 + 0x98) < *(ulong *)(lVar1 + 0x98)) {
      local_28 = local_28 + 1;
    }
    else if (*(int *)(lVar1 + 0x90) < *(int *)(lVar2 + 0x90)) {
      ret = ret + 1;
    }
    else {
      if (*(int *)(lVar1 + 0x90) <= *(int *)(lVar2 + 0x90)) {
        if (*(ulong *)(lVar2 + 0xb8) < *(ulong *)(lVar1 + 0xb8)) {
          pvx.e[2]._4_4_ = -1;
          goto LAB_0014ffa0;
        }
        if (*(ulong *)(lVar1 + 0xb8) < *(ulong *)(lVar2 + 0xb8)) {
          pvx.e[2]._4_4_ = 1;
          goto LAB_0014ffa0;
        }
        if (*(uint *)(lVar1 + 0x30) < *(uint *)(lVar2 + 0x30)) {
          pvx.e[2]._4_4_ = -1;
          goto LAB_0014ffa0;
        }
        if (*(uint *)(lVar2 + 0x30) < *(uint *)(lVar1 + 0x30)) {
          pvx.e[2]._4_4_ = 1;
          goto LAB_0014ffa0;
        }
        ret = ret + 1;
      }
      local_28 = local_28 + 1;
    }
  }
  pvx.e[2]._4_4_ = 0;
LAB_0014ffa0:
  if ((pvx._0_8_ != 0) && ((PNode ***)pvx._0_8_ != &pvx.v)) {
    free((void *)pvx._0_8_);
  }
  pvy.e[2]._0_4_ = 0;
  pvx.n = 0;
  pvx.i = 0;
  if ((pvy._0_8_ != 0) && ((PNode ***)pvy._0_8_ != &pvy.v)) {
    free((void *)pvy._0_8_);
  }
  return pvx.e[2]._4_4_;
}

Assistant:

static int cmp_greediness(Parser *p, PNode *x, PNode *y) {
  uint ix = 0, iy = 0;
  int ret = 0;

  VecPNode pvx, pvy;
  vec_clear(&pvx);
  vec_clear(&pvy);
  get_unshared_pnodes(p, x, y, &pvx, &pvy);
  if (pvx.v != NULL) qsort(pvx.v, pvx.n, sizeof(PNode *), greedycmp);
  if (pvy.v != NULL) qsort(pvy.v, pvy.n, sizeof(PNode *), greedycmp);
  while (1) {
    if (pvx.n <= ix || pvy.n <= iy) RET(0);
    x = pvx.v[ix];
    y = pvy.v[iy];
    if (x == y) {
      ix++;
      iy++;
    } else if (x->parse_node.start_loc.s < y->parse_node.start_loc.s)
      ix++;
    else if (x->parse_node.start_loc.s > y->parse_node.start_loc.s)
      iy++;
    else if (x->parse_node.symbol < y->parse_node.symbol)
      ix++;
    else if (x->parse_node.symbol > y->parse_node.symbol)
      iy++;
    else if (x->parse_node.end > y->parse_node.end)
      RET(-1);
    else if (x->parse_node.end < y->parse_node.end)
      RET(1);
    else if (x->children.n < y->children.n)
      RET(-1);
    else if (x->children.n > y->children.n)
      RET(1);
    else {
      ix++;
      iy++;
    }
  }
Lreturn:
  vec_free(&pvx);
  vec_free(&pvy);
  return ret;
}